

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::TextureFilterMinmaxUtils(TextureFilterMinmaxUtils *this)

{
  Texture1D *this_00;
  Texture1DArray *this_01;
  Texture2D *this_02;
  Texture2DArray *this_03;
  Texture3D *this_04;
  TextureCube *this_05;
  SupportedTextureDataType local_a4;
  SupportedTextureDataType local_98;
  SupportedTextureDataType local_8c;
  SupportedTextureDataType local_80;
  SupportedTextureDataType local_74;
  TextureCube *local_68;
  Texture3D *local_60;
  Texture2DArray *local_58;
  Texture2D *local_50;
  Texture1DArray *local_48;
  Texture1D *local_40;
  ReductionModeParam local_34;
  ReductionModeParam local_2c [2];
  ReductionModeParam local_18;
  TextureFilterMinmaxUtils *local_10;
  TextureFilterMinmaxUtils *this_local;
  
  local_10 = this;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::vector(&this->m_reductionModeParams);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::vector(&this->m_supportedTextureDataTypes);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::vector(&this->m_supportedTextureTypes);
  ReductionModeParam::ReductionModeParam(&local_18,0x8007,false);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::push_back(&this->m_reductionModeParams,&local_18);
  ReductionModeParam::ReductionModeParam(local_2c,0x9367,false);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::push_back(&this->m_reductionModeParams,local_2c);
  ReductionModeParam::ReductionModeParam(&local_34,0x8008,false);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
  ::push_back(&this->m_reductionModeParams,&local_34);
  this_00 = (Texture1D *)operator_new(0x68);
  Texture1D::Texture1D(this_00);
  local_40 = this_00;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::push_back(&this->m_supportedTextureTypes,(value_type *)&local_40);
  this_01 = (Texture1DArray *)operator_new(0x68);
  Texture1DArray::Texture1DArray(this_01);
  local_48 = this_01;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::push_back(&this->m_supportedTextureTypes,(value_type *)&local_48);
  this_02 = (Texture2D *)operator_new(0x68);
  Texture2D::Texture2D(this_02);
  local_50 = this_02;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::push_back(&this->m_supportedTextureTypes,(value_type *)&local_50);
  this_03 = (Texture2DArray *)operator_new(0x68);
  Texture2DArray::Texture2DArray(this_03);
  local_58 = this_03;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::push_back(&this->m_supportedTextureTypes,(value_type *)&local_58);
  this_04 = (Texture3D *)operator_new(0x68);
  Texture3D::Texture3D(this_04);
  local_60 = this_04;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::push_back(&this->m_supportedTextureTypes,(value_type *)&local_60);
  this_05 = (TextureCube *)operator_new(0x68);
  TextureCube::TextureCube(this_05);
  local_68 = this_05;
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  ::push_back(&this->m_supportedTextureTypes,(value_type *)&local_68);
  SupportedTextureDataType::SupportedTextureDataType(&local_74,0x1903,0x1406,1);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::push_back(&this->m_supportedTextureDataTypes,&local_74);
  SupportedTextureDataType::SupportedTextureDataType(&local_80,0x1903,0x1401,1);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::push_back(&this->m_supportedTextureDataTypes,&local_80);
  SupportedTextureDataType::SupportedTextureDataType(&local_8c,0x1902,0x1406,0xd);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::push_back(&this->m_supportedTextureDataTypes,&local_8c);
  SupportedTextureDataType::SupportedTextureDataType(&local_98,0x1902,0x1401,0xd);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::push_back(&this->m_supportedTextureDataTypes,&local_98);
  SupportedTextureDataType::SupportedTextureDataType(&local_a4,0x1909,0x1406,2);
  std::
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  ::push_back(&this->m_supportedTextureDataTypes,&local_a4);
  return;
}

Assistant:

TextureFilterMinmaxUtils::TextureFilterMinmaxUtils()
{
	m_reductionModeParams.push_back(ReductionModeParam(GL_MIN, false));
	m_reductionModeParams.push_back(ReductionModeParam(GL_WEIGHTED_AVERAGE_ARB, false));
	m_reductionModeParams.push_back(ReductionModeParam(GL_MAX, false));

	m_supportedTextureTypes.push_back(new Texture1D());
	m_supportedTextureTypes.push_back(new Texture1DArray());
	m_supportedTextureTypes.push_back(new Texture2D());
	m_supportedTextureTypes.push_back(new Texture2DArray());
	m_supportedTextureTypes.push_back(new Texture3D());
	m_supportedTextureTypes.push_back(new TextureCube());

	m_supportedTextureDataTypes.push_back(SupportedTextureDataType(GL_RED, GL_FLOAT, MINMAX));
	m_supportedTextureDataTypes.push_back(SupportedTextureDataType(GL_RED, GL_UNSIGNED_BYTE, MINMAX));
	m_supportedTextureDataTypes.push_back(
		SupportedTextureDataType(GL_DEPTH_COMPONENT, GL_FLOAT, MINMAX | EXCLUDE_3D | EXCLUDE_CUBE));
	m_supportedTextureDataTypes.push_back(
		SupportedTextureDataType(GL_DEPTH_COMPONENT, GL_UNSIGNED_BYTE, MINMAX | EXCLUDE_3D | EXCLUDE_CUBE));
	m_supportedTextureDataTypes.push_back(SupportedTextureDataType(GL_LUMINANCE, GL_FLOAT, COMPATIBILITY));
}